

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

bool __thiscall ON_Brep::IsValidVertex(ON_Brep *this,int vertex_index,ON_TextLog *text_log)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  ON_BrepVertex *pOVar4;
  int *piVar5;
  ON_BrepEdge *pOVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  
  uVar9 = (ulong)(uint)vertex_index;
  if (vertex_index < 0 ||
      (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count <=
      vertex_index) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,
                        "brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",uVar9)
      ;
    }
  }
  else {
    pOVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    if (pOVar4[uVar9].m_vertex_index == vertex_index) {
      uVar8 = (ulong)pOVar4[uVar9].m_ei.m_count;
      if (0 < (long)uVar8) {
        piVar5 = pOVar4[uVar9].m_ei.m_a;
        pOVar6 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
        uVar13 = 0;
        do {
          uVar3 = piVar5[uVar13];
          lVar14 = (long)(int)uVar3;
          if ((lVar14 < 0) ||
             ((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count
              <= (int)uVar3)) {
            if (text_log == (ON_TextLog *)0x0) goto LAB_003ed4b4;
            ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar9);
            ON_TextLog::PushIndent(text_log);
            uVar9 = (ulong)(uint)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                                 super_ON_ClassArray<ON_BrepEdge>.m_count;
            pcVar11 = "vertex.m_ei[%d] = %d (should be >=0 and <%d).\n";
            uVar13 = uVar13 & 0xffffffff;
LAB_003ed661:
            ON_TextLog::Print(text_log,pcVar11,uVar13,(ulong)uVar3,uVar9);
            goto LAB_003ed4af;
          }
          if (uVar3 != pOVar6[lVar14].m_edge_index) {
            if (text_log == (ON_TextLog *)0x0) goto LAB_003ed4b4;
            ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar9);
            ON_TextLog::PushIndent(text_log);
            pcVar11 = "vertex.m_ei[%d] = %d is a deleted edge.\n";
            uVar13 = uVar13 & 0xffffffff;
            uVar9 = (ulong)uVar3;
            goto LAB_003ed4a5;
          }
          if (uVar13 != 0) {
            uVar12 = 1;
            uVar10 = 0;
            do {
              if (piVar5[uVar10] == uVar3) {
                if ((pOVar6[lVar14].m_vi[0] == vertex_index) &&
                   (pOVar6[lVar14].m_vi[1] == vertex_index)) goto LAB_003ed3e4;
                if (text_log == (ON_TextLog *)0x0) goto LAB_003ed4b4;
                ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar9);
                ON_TextLog::PushIndent(text_log);
                ON_TextLog::Print(text_log,
                                  "vertex.m_ei[%d] and vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[0] = %d"
                                  ,uVar10 & 0xffffffff,uVar13 & 0xffffffff,(ulong)uVar3,(ulong)uVar3
                                  ,(ulong)(uint)pOVar6[lVar14].m_vi[0]);
                pcVar11 = "and ON_Brep.m_E[%d].m_vi[1] = %d (both m_vi[] values should be %d).\n";
                uVar13 = (ulong)uVar3;
                uVar3 = pOVar6[lVar14].m_vi[1];
                goto LAB_003ed661;
              }
              uVar10 = uVar10 + 1;
              uVar12 = uVar12 + 1;
            } while (uVar13 != uVar10);
          }
LAB_003ed3b3:
          if ((pOVar6[lVar14].m_vi[0] != vertex_index) && (pOVar6[lVar14].m_vi[1] != vertex_index))
          {
            if (text_log == (ON_TextLog *)0x0) goto LAB_003ed4b4;
            ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar9);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,
                              "vertex.m_ei[%d] = %d but ON_Brep.m_E[%d].m_vi[] = [%d,%d]. At least one edge m_vi[] value should be %d.\n"
                              ,uVar13 & 0xffffffff,(ulong)uVar3,(ulong)uVar3,
                              (ulong)(uint)pOVar6[lVar14].m_vi[0],
                              (ulong)(uint)pOVar6[lVar14].m_vi[1],uVar9);
            goto LAB_003ed4af;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar8);
      }
      if (0.0 < pOVar4[uVar9].m_tolerance || pOVar4[uVar9].m_tolerance == 0.0) {
        return true;
      }
      if (text_log == (ON_TextLog *)0x0) goto LAB_003ed4b4;
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar9);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.m_tolerace = %g (should be >= 0.0)\n",
                        pOVar4[uVar9].m_tolerance);
    }
    else {
      if (text_log == (ON_TextLog *)0x0) goto LAB_003ed4b4;
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index);
      ON_TextLog::PushIndent(text_log);
      uVar13 = (ulong)(uint)pOVar4[uVar9].m_vertex_index;
      pcVar11 = "vertex.m_vertex_index = %d (should be %d).\n";
LAB_003ed4a5:
      ON_TextLog::Print(text_log,pcVar11,uVar13,uVar9);
    }
LAB_003ed4af:
    ON_TextLog::PopIndent(text_log);
  }
LAB_003ed4b4:
  bVar7 = ON_IsNotValid();
  return bVar7;
LAB_003ed3e4:
  if (uVar13 <= uVar12) goto LAB_003ed3b3;
  uVar1 = uVar12 + 1;
  puVar2 = (uint *)(piVar5 + uVar12);
  uVar12 = uVar1;
  if (*puVar2 == uVar3) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_003ed4b4;
    ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar9);
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"vertex.m_ei[%d,%d,%d] = %d. An open edge index should appear once\n"
                      ,uVar10 & 0xffffffff,uVar13 & 0xffffffff,(ulong)((int)uVar1 - 1),(ulong)uVar3)
    ;
    ON_TextLog::Print(text_log,"in vertex.m_ei[] and a closed edge index should appear twice.\n");
    goto LAB_003ed4af;
  }
  goto LAB_003ed3e4;
}

Assistant:

bool
ON_Brep::IsValidVertex( int vertex_index, ON_TextLog* text_log ) const
{
  if ( vertex_index < 0 || vertex_index >= m_V.Count() )
  {
    if ( text_log )
      text_log->Print("brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                      vertex_index, m_V.Count());
    return ON_BrepIsNotValid();
  }
  const ON_BrepVertex& vertex = m_V[vertex_index];
  if ( vertex.m_vertex_index != vertex_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_vertex_index = %d (should be %d).\n",
                       vertex.m_vertex_index, vertex_index );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  const int vertex_edge_count = vertex.m_ei.Count();
  int i, j, vei, ei;
  for ( vei = 0; vei < vertex_edge_count; vei++ ) {
    ei = vertex.m_ei[vei];
    if ( ei < 0 || ei >= m_E.Count() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d (should be >=0 and <%d).\n", vei, ei, m_E.Count());
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    const ON_BrepEdge& edge = m_E[ei];
    if ( ei != edge.m_edge_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d is a deleted edge.\n", vei, ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    for ( i = 0; i < vei; i++ ) 
    {
      if ( vertex.m_ei[i] == ei ) 
      {
        // edge should be closed
        if ( edge.m_vi[0] != vertex_index || edge.m_vi[1] != vertex_index )
        {
          if ( text_log )
          {
            text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
            text_log->PushIndent();
            text_log->Print("vertex.m_ei[%d] and vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[0] = %d",
                             i,vei,ei,ei,edge.m_vi[0]);
            text_log->Print("and ON_Brep.m_E[%d].m_vi[1] = %d (both m_vi[] values should be %d).\n",
                            ei,edge.m_vi[1],vertex_index);
            text_log->PopIndent();
          }
          return ON_BrepIsNotValid();
        }
        for (j = i+1; j < vei; j++ ) 
        {
          if ( vertex.m_ei[j] == ei )
          {
            if ( text_log )
            {
              text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
              text_log->PushIndent();
              text_log->Print("vertex.m_ei[%d,%d,%d] = %d. An open edge index should appear once\n",i,vei,j,ei);
              text_log->Print("in vertex.m_ei[] and a closed edge index should appear twice.\n");
              text_log->PopIndent();
            }
            return ON_BrepIsNotValid();
          }
        }
        break;
      }
    }
    if ( edge.m_vi[0] != vertex_index && edge.m_vi[1] != vertex_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d but ON_Brep.m_E[%d].m_vi[] = [%d,%d]. "
                        "At least one edge m_vi[] value should be %d.\n",
                        vei,ei,ei,edge.m_vi[0],edge.m_vi[1],vertex_index);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
  }

  if ( vertex.m_tolerance < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_tolerace = %g (should be >= 0.0)\n",vertex.m_tolerance);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  return true;
}